

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_U8StringViewLiteral_Test::~FormatTest_U8StringViewLiteral_Test
          (FormatTest_U8StringViewLiteral_Test *this)

{
  void *in_RDI;
  
  ~FormatTest_U8StringViewLiteral_Test((FormatTest_U8StringViewLiteral_Test *)0x1a0858);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatTest, U8StringViewLiteral) {
  using namespace fmt::literals;
  fmt::u8string_view s = "ab"_u;
  EXPECT_EQ(s.size(), 2u);
  const fmt::char8_t *data = s.data();
  EXPECT_EQ(data[0], 'a');
  EXPECT_EQ(data[1], 'b');
  EXPECT_EQ(format("{:*^5}"_u, "🤡"_u), "**🤡**"_u);
}